

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

int KBHit(void)

{
  uint uVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  uchar ch;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  tcgetattr(0,(termios *)&KBHit::initial_settings);
  KBHit::new_settings.c_iflag = KBHit::initial_settings.c_iflag;
  KBHit::new_settings.c_oflag = KBHit::initial_settings.c_oflag;
  KBHit::new_settings.c_cc[7] = KBHit::initial_settings.c_cc[7];
  KBHit::new_settings.c_cc[8] = KBHit::initial_settings.c_cc[8];
  KBHit::new_settings.c_cc[9] = KBHit::initial_settings.c_cc[9];
  KBHit::new_settings.c_cc[10] = KBHit::initial_settings.c_cc[10];
  KBHit::new_settings.c_cc[0xb] = KBHit::initial_settings.c_cc[0xb];
  KBHit::new_settings.c_cc[0xc] = KBHit::initial_settings.c_cc[0xc];
  KBHit::new_settings.c_cc[0xd] = KBHit::initial_settings.c_cc[0xd];
  KBHit::new_settings.c_cc[0xe] = KBHit::initial_settings.c_cc[0xe];
  KBHit::new_settings.c_cc[0xf] = KBHit::initial_settings.c_cc[0xf];
  KBHit::new_settings.c_cc[0x10] = KBHit::initial_settings.c_cc[0x10];
  KBHit::new_settings.c_cc[0x11] = KBHit::initial_settings.c_cc[0x11];
  KBHit::new_settings.c_cc[0x12] = KBHit::initial_settings.c_cc[0x12];
  KBHit::new_settings.c_cc[0x13] = KBHit::initial_settings.c_cc[0x13];
  KBHit::new_settings.c_cc[0x14] = KBHit::initial_settings.c_cc[0x14];
  KBHit::new_settings.c_cc[0x15] = KBHit::initial_settings.c_cc[0x15];
  KBHit::new_settings.c_cc[0x16] = KBHit::initial_settings.c_cc[0x16];
  KBHit::new_settings.c_cc[0x17] = KBHit::initial_settings.c_cc[0x17];
  KBHit::new_settings.c_cc[0x18] = KBHit::initial_settings.c_cc[0x18];
  KBHit::new_settings.c_cc[0x19] = KBHit::initial_settings.c_cc[0x19];
  KBHit::new_settings.c_cc[0x1a] = KBHit::initial_settings.c_cc[0x1a];
  KBHit::new_settings.c_cc[0x1b] = KBHit::initial_settings.c_cc[0x1b];
  KBHit::new_settings.c_cc[0x1c] = KBHit::initial_settings.c_cc[0x1c];
  KBHit::new_settings.c_cc[0x1d] = KBHit::initial_settings.c_cc[0x1d];
  KBHit::new_settings.c_cc[0x1e] = KBHit::initial_settings.c_cc[0x1e];
  KBHit::new_settings.c_cc[0x1f] = KBHit::initial_settings.c_cc[0x1f];
  KBHit::new_settings._49_3_ = KBHit::initial_settings._49_3_;
  KBHit::new_settings.c_ispeed = KBHit::initial_settings.c_ispeed;
  KBHit::new_settings.c_ospeed = KBHit::initial_settings.c_ospeed;
  KBHit::new_settings._8_8_ = KBHit::initial_settings._8_8_ & 0xfffffff4ffffffff;
  KBHit::new_settings._16_6_ = KBHit::initial_settings._16_6_;
  KBHit::new_settings.c_cc[5] = '\0';
  KBHit::new_settings.c_cc[6] = '\x01';
  tcsetattr(0,0,(termios *)&KBHit::new_settings);
  KBHit::new_settings._16_8_ = KBHit::new_settings._16_8_ & 0xffffffffffffff;
  tcsetattr(0,0,(termios *)&KBHit::new_settings);
  sVar2 = read(0,&local_21,1);
  KBHit::new_settings.c_cc[6] = '\x01';
  tcsetattr(0,0,(termios *)&KBHit::initial_settings);
  uVar1 = (uint)local_21;
  if ((int)sVar2 != 1) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

int	KBHit()
{
#ifdef WIN32
	if(kbhit())	return	getch();
#else
	static struct termios initial_settings, new_settings;

	tcgetattr(0,&initial_settings);
	new_settings = initial_settings;
	new_settings.c_lflag &= ~ICANON;
	new_settings.c_lflag &= ~ECHO;
	new_settings.c_lflag &= ~ISIG;
	new_settings.c_cc[VMIN] = 1;
	new_settings.c_cc[VTIME] = 0;
	tcsetattr(0, TCSANOW, &new_settings);

	unsigned char ch;

	new_settings.c_cc[VMIN]=0;
	tcsetattr(0, TCSANOW, &new_settings);
	int nread = read(0,&ch,1);
	new_settings.c_cc[VMIN]=1;
	tcsetattr(0, TCSANOW, &initial_settings);
	if(nread == 1)	return	ch;
#endif
	return 0;
}